

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

int __thiscall rw::ColorQuant::init(ColorQuant *this,EVP_PKEY_CTX *ctx)

{
  Node *pNVar1;
  void *pvVar2;
  
  (this->leaves).link.next = &(this->leaves).link;
  (this->leaves).link.prev = &(this->leaves).link;
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/image.cpp line: 1117"
  ;
  pNVar1 = (Node *)(*DAT_00148858)(0xb0);
  pNVar1->r = 0;
  pNVar1->g = 0;
  pNVar1->b = 0;
  pNVar1->a = 0;
  pNVar1->numPixels = 0;
  pvVar2 = memset(&pNVar1->parent,0,0x98);
  this->root = pNVar1;
  return (int)pvVar2;
}

Assistant:

void
ColorQuant::init(void)
{
	this->leaves.init();
	this->root = this->createNode(QUANTDEPTH);
}